

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode ossl_connect_step3(connectdata *conn,int sockindex)

{
  byte bVar1;
  CURLcode CVar2;
  _Bool local_31;
  ssl_connect_data *connssl;
  CURLcode result;
  int sockindex_local;
  connectdata *conn_local;
  
  if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    bVar1 = (conn->proxy_ssl_config).field_0x48;
  }
  else {
    bVar1 = (conn->ssl_config).field_0x48;
  }
  local_31 = true;
  if ((bVar1 & 1) == 0) {
    if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
       (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
      bVar1 = (conn->proxy_ssl_config).field_0x48;
    }
    else {
      bVar1 = (conn->ssl_config).field_0x48;
    }
    local_31 = (bVar1 >> 1 & 1) != 0;
  }
  CVar2 = servercert(conn,conn->ssl + sockindex,local_31);
  if (CVar2 == CURLE_OK) {
    conn->ssl[sockindex].connecting_state = ssl_connect_done;
  }
  return CVar2;
}

Assistant:

static CURLcode ossl_connect_step3(struct connectdata *conn, int sockindex)
{
  CURLcode result = CURLE_OK;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];

  DEBUGASSERT(ssl_connect_3 == connssl->connecting_state);

  /*
   * We check certificates to authenticate the server; otherwise we risk
   * man-in-the-middle attack; NEVERTHELESS, if we're told explicitly not to
   * verify the peer ignore faults and failures from the server cert
   * operations.
   */

  result = servercert(conn, connssl, (SSL_CONN_CONFIG(verifypeer) ||
                                      SSL_CONN_CONFIG(verifyhost)));

  if(!result)
    connssl->connecting_state = ssl_connect_done;

  return result;
}